

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O0

void __thiscall ON_PointGrid::ON_PointGrid(ON_PointGrid *this,int c0,int c1)

{
  int c1_local;
  int c0_local;
  ON_PointGrid *this_local;
  
  ON_Geometry::ON_Geometry(&this->super_ON_Geometry);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00b76a38;
  ON_3dPointArray::ON_3dPointArray(&this->m_point);
  Initialize(this);
  Create(this,c0,c1);
  return;
}

Assistant:

ON_PointGrid::ON_PointGrid( int c0, int c1 )
{
  Initialize();
  Create(c0,c1);
}